

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fMultisampleTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::MaskInvertCase::drawPattern
          (MaskInvertCase *this,bool invert)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  deUint32 dVar6;
  deUint32 dVar7;
  uint uVar8;
  undefined7 in_register_00000031;
  int iVar9;
  float fVar10;
  float fVar11;
  float __x;
  Vec2 local_60;
  Vec2 local_58;
  Vec2 local_50;
  Vec4 local_48;
  
  iVar2 = (*((this->super_DefaultFBOMultisampleCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  for (dVar7 = 0; dVar7 != 0x19; dVar7 = dVar7 + 1) {
    fVar10 = (float)(int)dVar7;
    fVar11 = fVar10 / 25.0;
    local_48.m_data[0] = fVar11 * 0.6 + 0.4;
    local_48.m_data[1] = fVar11 * 0.3 + 0.5;
    local_48.m_data[2] = -fVar11 * 0.5 + 0.6;
    local_48.m_data[3] = -fVar11 * 0.7 + 0.7;
    iVar4 = (this->super_DefaultFBOMultisampleCase).m_numSamples;
    iVar1 = iVar4 + -1;
    iVar3 = iVar1 / 0x20;
    iVar4 = (iVar1 / -0x20) * 0x20 + iVar4;
    iVar1 = -1;
    if (-1 < iVar3) {
      iVar1 = iVar3;
    }
    dVar6 = dVar7;
    iVar9 = 0;
    while (iVar1 + 1 != iVar9) {
      dVar5 = deUint32Hash(dVar6);
      uVar8 = 0xffffffff;
      if (iVar3 == iVar9) {
        uVar8 = ~(-1 << ((byte)iVar4 & 0x1f));
      }
      if (0x1f < iVar4) {
        uVar8 = 0xffffffff;
      }
      (**(code **)(CONCAT44(extraout_var,iVar2) + 0x1258))
                (iVar9,uVar8 & (dVar5 ^ -(int)CONCAT71(in_register_00000031,invert)));
      dVar6 = dVar6 + 0x20;
      iVar9 = iVar9 + 1;
    }
    fVar11 = (fVar10 * 6.2831855) / 25.0;
    __x = ((fVar10 + 0.5) * 6.2831855) / 25.0;
    dVar6 = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
    glu::checkError(dVar6,"glSampleMaski",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleTests.cpp"
                    ,0x20b);
    local_50.m_data[0] = 0.0;
    local_50.m_data[1] = 0.0;
    fVar10 = cosf(fVar11);
    fVar11 = sinf(fVar11);
    local_58.m_data[1] = fVar11 * (float)0x3f733333;
    local_58.m_data[0] = fVar10 * (float)0x3f733333;
    fVar10 = cosf(__x);
    fVar11 = sinf(__x);
    local_60.m_data[1] = fVar11 * (float)0x3f733333;
    local_60.m_data[0] = fVar10 * (float)0x3f733333;
    DefaultFBOMultisampleCase::renderTriangle
              (&this->super_DefaultFBOMultisampleCase,&local_50,&local_58,&local_60,&local_48,
               &local_48,&local_48);
  }
  return;
}

Assistant:

void MaskInvertCase::drawPattern (bool invert) const
{
	const int				numTriangles	= 25;
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();

	for (int triNdx = 0; triNdx < numTriangles; triNdx++)
	{
		const float	angle0	= 2.0f*DE_PI * (float)triNdx			/ (float)numTriangles;
		const float	angle1	= 2.0f*DE_PI * ((float)triNdx + 0.5f)	/ (float)numTriangles;
		const Vec4	color	= Vec4(0.4f + (float)triNdx/(float)numTriangles*0.6f,
		                           0.5f + (float)triNdx/(float)numTriangles*0.3f,
		                           0.6f - (float)triNdx/(float)numTriangles*0.5f,
		                           0.7f - (float)triNdx/(float)numTriangles*0.7f);


		const int			wordCount		= getEffectiveSampleMaskWordCount(m_numSamples - 1);
		const GLbitfield	finalWordBits	= m_numSamples - 32 * ((m_numSamples-1) / 32);
		const GLbitfield	finalWordMask	= (GLbitfield)deBitMask32(0, (int)finalWordBits);

		for (int wordNdx = 0; wordNdx < wordCount; ++wordNdx)
		{
			const GLbitfield	rawMask		= (GLbitfield)deUint32Hash(wordNdx * 32 + triNdx);
			const GLbitfield	mask		= (invert) ? (~rawMask) : (rawMask);
			const bool			isFinalWord	= (wordNdx + 1) == wordCount;
			const GLbitfield	maskMask	= (isFinalWord) ? (finalWordMask) : (0xFFFFFFFFUL); // maskMask prevents setting coverage bits higher than sample count

			gl.sampleMaski(wordNdx, mask & maskMask);
		}
		GLU_EXPECT_NO_ERROR(gl.getError(), "glSampleMaski");

		renderTriangle(Vec2(0.0f, 0.0f),
					   Vec2(deFloatCos(angle0)*0.95f, deFloatSin(angle0)*0.95f),
					   Vec2(deFloatCos(angle1)*0.95f, deFloatSin(angle1)*0.95f),
					   color);
	}
}